

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  string local_2d8;
  undefined1 local_2b8 [8];
  string f;
  string dir;
  Names local_270;
  Names local_1b0;
  undefined1 local_e0 [8];
  Names targetNames;
  cmGlobalGenerator *gg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return;
  }
  targetNames.SharedObject.field_2._8_8_ =
       cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  Names::Names((Names *)local_e0);
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames(&local_1b0,this,config);
    Names::operator=((Names *)local_e0,&local_1b0);
    Names::~Names(&local_1b0);
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) goto LAB_003b439f;
    GetLibraryNames(&local_270,this,config);
    Names::operator=((Names *)local_e0,&local_270);
    Names::~Names(&local_270);
  }
  GetDirectory((string *)((long)&f.field_2 + 8),this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::string((string *)local_2b8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_2b8,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_2b8,"/");
    std::__cxx11::string::operator+=
              ((string *)local_2b8,(string *)(targetNames.Base.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_2b8,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_2b8,"/");
    std::__cxx11::string::operator+=
              ((string *)local_2b8,(string *)(targetNames.PDB.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_2b8,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_2b8,"/");
    std::__cxx11::string::operator+=
              ((string *)local_2b8,(string *)(targetNames.Output.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_2b8,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_2b8,"/");
    std::__cxx11::string::operator+=
              ((string *)local_2b8,(string *)(targetNames.ImportLibrary.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    GetDirectory(&local_2d8,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::operator+=((string *)local_2b8,"/");
    std::__cxx11::string::operator+=
              ((string *)local_2b8,(string *)(targetNames.Real.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)(f.field_2._M_local_buf + 8));
LAB_003b439f:
  Names::~Names((Names *)local_e0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  cmGeneratorTarget::Names targetNames;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    targetNames = this->GetExecutableNames(config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames = this->GetLibraryNames(config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!targetNames.Output.empty()) {
    f = dir;
    f += "/";
    f += targetNames.Output;
    gg->AddToManifest(f);
  }
  if (!targetNames.SharedObject.empty()) {
    f = dir;
    f += "/";
    f += targetNames.SharedObject;
    gg->AddToManifest(f);
  }
  if (!targetNames.Real.empty()) {
    f = dir;
    f += "/";
    f += targetNames.Real;
    gg->AddToManifest(f);
  }
  if (!targetNames.PDB.empty()) {
    f = dir;
    f += "/";
    f += targetNames.PDB;
    gg->AddToManifest(f);
  }
  if (!targetNames.ImportLibrary.empty()) {
    f = this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact);
    f += "/";
    f += targetNames.ImportLibrary;
    gg->AddToManifest(f);
  }
}